

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O3

void __thiscall pm::Sampler::setupShuffleIndices(Sampler *this)

{
  iterator __position;
  uint uVar1;
  size_t __i;
  long lVar2;
  ulong uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  mt19937 g;
  random_device rd;
  uint local_275c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2758;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar1;
  lVar2 = 1;
  uVar3 = local_2740._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_2740._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_2740._M_p = 0x270;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->shuffledIndices_,(ulong)(this->numSets_ * this->numSamples_));
  local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_2758,(ulong)this->numSamples_);
  local_275c = 0;
  if (this->numSamples_ != 0) {
    do {
      if (local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2758,
                   (iterator)
                   local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_275c);
      }
      else {
        *local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_275c;
        local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_275c = local_275c + 1;
    } while (local_275c < this->numSamples_);
  }
  if (this->numSets_ != 0) {
    uVar1 = 0;
    do {
      std::
      shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_2740);
      if (this->numSamples_ != 0) {
        lVar2 = 0;
        uVar3 = 0;
        do {
          __position._M_current =
               (this->shuffledIndices_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->shuffledIndices_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->shuffledIndices_,
                       __position,
                       (uint *)((long)local_2758.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar2));
          }
          else {
            *__position._M_current =
                 *(uint *)((long)local_2758.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar2);
            (this->shuffledIndices_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 4;
        } while (uVar3 < this->numSamples_);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->numSets_);
  }
  if (local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2758.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void Sampler::setupShuffleIndices()
{
	std::random_device rd;
	std::mt19937 g(rd());

	shuffledIndices_.reserve(numSamples_ * numSets_);
	std::vector<unsigned int> indices;
	indices.reserve(numSamples_);

	for (unsigned int i = 0; i < numSamples_; i++)
		indices.push_back(i);

	for (unsigned int p = 0; p < numSets_; p++)
	{
		std::shuffle(indices.begin(), indices.end(), g);

		for (unsigned int i = 0; i < numSamples_; i++)
			shuffledIndices_.push_back(indices[i]);
	}
}